

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_inspect(REF_ADJ ref_adj)

{
  uint local_18;
  uint local_14;
  REF_INT item;
  REF_INT node;
  REF_ADJ ref_adj_local;
  
  printf("ref_adj = %p\n",ref_adj);
  printf(" blank = %d\n",(ulong)(uint)ref_adj->blank);
  for (local_14 = 0; (int)local_14 < ref_adj->nnode; local_14 = local_14 + 1) {
    printf(" first[%d] = %d\n",(ulong)local_14,(ulong)(uint)ref_adj->first[(int)local_14]);
  }
  for (local_18 = 0; (int)local_18 < ref_adj->nitem; local_18 = local_18 + 1) {
    printf(" item[%d] = %d : %d\n",(ulong)local_18,(ulong)(uint)ref_adj->item[(int)local_18].next,
           (ulong)(uint)ref_adj->item[(int)local_18].ref);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_inspect(REF_ADJ ref_adj) {
  REF_INT node, item;
  printf("ref_adj = %p\n", (void *)ref_adj);
  printf(" blank = %d\n", ref_adj->blank);
  for (node = 0; node < ref_adj_nnode(ref_adj); node++)
    printf(" first[%d] = %d\n", node, ref_adj->first[node]);
  for (item = 0; item < ref_adj_nitem(ref_adj); item++)
    printf(" item[%d] = %d : %d\n", item, ref_adj->item[item].next,
           ref_adj->item[item].ref);

  return REF_SUCCESS;
}